

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O1

void * v2i_subject_alt(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  bool bVar1;
  int iVar2;
  OPENSSL_STACK *sk;
  size_t sVar3;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  size_t sVar4;
  char *method_00;
  
  sk = OPENSSL_sk_new_null();
  if (sk != (OPENSSL_STACK *)0x0) {
    sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar3 == 0) {
      return sk;
    }
    sVar3 = 0;
    do {
      cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar3);
      iVar2 = x509v3_conf_name_matches(cnf->name,"email");
      if (((iVar2 == 0) || (cnf->value == (char *)0x0)) ||
         (iVar2 = strcmp(cnf->value,"copy"), iVar2 != 0)) {
        method_00 = "email";
        iVar2 = x509v3_conf_name_matches(cnf->name,"email");
        if ((iVar2 != 0) && (cnf->value != (char *)0x0)) {
          method_00 = "move";
          iVar2 = strcmp(cnf->value,"move");
          if (iVar2 == 0) {
            iVar2 = 1;
            goto LAB_00243a02;
          }
        }
        a = v2i_GENERAL_NAME_ex((GENERAL_NAME *)0x0,(X509V3_EXT_METHOD *)method_00,(X509V3_CTX *)ctx
                                ,cnf,0);
        if ((a == (GENERAL_NAME *)0x0) || (sVar4 = OPENSSL_sk_push(sk,a), sVar4 == 0)) {
          GENERAL_NAME_free(a);
          iVar2 = 5;
          bVar1 = false;
        }
        else {
          iVar2 = 0;
          bVar1 = true;
        }
        if (bVar1) goto LAB_00243a0b;
      }
      else {
        iVar2 = 0;
LAB_00243a02:
        iVar2 = copy_email(ctx,(GENERAL_NAMES *)sk,iVar2);
        if (iVar2 == 0) {
          iVar2 = 5;
        }
        else {
LAB_00243a0b:
          iVar2 = 0;
        }
      }
      if (iVar2 != 0) goto LAB_00243a33;
      sVar3 = sVar3 + 1;
      sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    } while (sVar3 < sVar4);
    iVar2 = 2;
LAB_00243a33:
    if (iVar2 != 5) {
      return sk;
    }
    OPENSSL_sk_pop_free_ex(sk,sk_GENERAL_NAME_call_free_func,GENERAL_NAME_free);
  }
  return (void *)0x0;
}

Assistant:

static void *v2i_subject_alt(const X509V3_EXT_METHOD *method,
                             const X509V3_CTX *ctx,
                             const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (x509v3_conf_name_matches(cnf->name, "email") && cnf->value &&
        !strcmp(cnf->value, "copy")) {
      if (!copy_email(ctx, gens, 0)) {
        goto err;
      }
    } else if (x509v3_conf_name_matches(cnf->name, "email") && cnf->value &&
               !strcmp(cnf->value, "move")) {
      if (!copy_email(ctx, gens, 1)) {
        goto err;
      }
    } else {
      GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
      if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
        GENERAL_NAME_free(gen);
        goto err;
      }
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}